

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O0

void __thiscall osThread::WaitForExit(osThread *this,int32_t millisecondWaitTimeout)

{
  int32_t millisecondWaitTimeout_local;
  osThread *this_local;
  
  return;
}

Assistant:

void osThread::WaitForExit(int32_t millisecondWaitTimeout)
{
#ifdef _WIN32
    if (millisecondWaitTimeout < 0)
    {
        millisecondWaitTimeout = INFINITE;
    }
    WaitForSingleObject(Handle, millisecondWaitTimeout);
#elif __linux__
#endif
}